

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

LoopEvent rec_for(jit_State *J,BCIns *fori,int isforl)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  byte bVar4;
  IRRef1 IVar5;
  IRRef1 IVar6;
  ushort uVar7;
  TRef TVar8;
  IRType t;
  uint uVar9;
  bool bVar10;
  BCIns *pBVar11;
  long lVar12;
  uint *puVar13;
  LoopEvent LVar14;
  TValue *o;
  undefined4 uVar15;
  double dVar16;
  ScEvEntry scev;
  uint local_54;
  ScEvEntry local_40;
  
  bVar3 = *(byte *)((long)fori + 1);
  o = (TValue *)((ulong)((uint)bVar3 * 8) + (long)J->L->base);
  puVar13 = (uint *)((ulong)((uint)bVar3 * 4) + (long)J->base);
  if (isforl == 0) {
    lj_meta_for(J->L,o);
    t = IRT_NUM;
    if ((*puVar13 & 0x1f000000) == 0x13000000) {
      t = lj_opt_narrow_forl(J,o);
    }
    lVar12 = 0;
    do {
      uVar9 = puVar13[lVar12];
      if (uVar9 == 0) {
        sload(J,(uint)bVar3 + (int)lVar12);
        uVar9 = puVar13[lVar12];
      }
      if ((uVar9 & 0x1f000000) == 0x4000000) {
        (J->fold).ins.field_0.op1 = (IRRef1)uVar9;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5c8e0000;
        uVar9 = lj_opt_fold(J);
        puVar13[lVar12] = uVar9;
      }
      if (t == IRT_IGC) {
        uVar15 = 0x5993326e;
        if (4 < (uVar9 >> 0x18 & 0x1f) - 0xf) {
LAB_001515d4:
          (J->fold).ins.field_0.op1 = (IRRef1)uVar9;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = uVar15;
          TVar8 = lj_opt_fold(J);
          puVar13[lVar12] = TVar8;
        }
      }
      else {
        uVar15 = 0x590e01d3;
        if ((uVar9 & 0x1f000000) != 0xe000000) goto LAB_001515d4;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    local_54 = puVar13[1];
    puVar13[3] = *puVar13;
    rec_for_check(J,t,~*(uint *)((long)o + 0x14) >> 0x1f,local_54,puVar13[2],1);
  }
  else {
    if (((BCIns *)(ulong)(J->scev).pc.ptr32 == fori) &&
       (IVar5 = (J->scev).idx, IVar5 == (IRRef1)*puVar13)) {
      bVar4 = (J->scev).t.irt;
      uVar7 = (J->scev).stop;
      IVar6 = (J->scev).step;
      (J->fold).ins.field_0.ot = bVar4 | 0x2900;
      (J->fold).ins.field_0.op1 = IVar5;
      (J->fold).ins.field_0.op2 = IVar6;
      TVar8 = lj_opt_fold(J);
      *puVar13 = TVar8;
      puVar13[3] = TVar8;
      local_40.t.irt = bVar4;
      local_40.stop = uVar7;
    }
    else {
      rec_for_loop(J,fori,&local_40,0);
    }
    local_54 = (uint)local_40.stop;
    t = (IRType)local_40.t.irt;
  }
  dVar16 = o->n;
  dVar1 = o[2].n;
  if (isforl != 0) {
    dVar16 = dVar16 + dVar1;
  }
  dVar2 = o[1].n;
  if ((long)dVar1 < 0) {
    uVar7 = 0;
    if (dVar16 < dVar2) goto LAB_0015167a;
    bVar10 = dVar1 + dVar1 + dVar16 < dVar2;
    uVar7 = 0x100;
  }
  else {
    uVar7 = 0x300;
    if (dVar2 < dVar16) {
LAB_0015167a:
      J->maxslot = bVar3 + 4;
      pBVar11 = fori + 1;
      LVar14 = LOOPEV_LEAVE;
      bVar10 = true;
      goto LAB_001516d4;
    }
    bVar10 = dVar2 < dVar1 + dVar1 + dVar16;
    uVar7 = 0x200;
  }
  LVar14 = LOOPEV_ENTER - bVar10;
  J->maxslot = (uint)bVar3;
  pBVar11 = fori + ((ulong)*(ushort *)((long)fori + 2) - 0x7fff);
  bVar10 = false;
LAB_001516d4:
  J->pc = pBVar11;
  lj_snap_add(J);
  uVar9 = *puVar13;
  (J->fold).ins.field_0.ot = (ushort)t | uVar7 | 0x80;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar9;
  (J->fold).ins.field_0.op2 = (IRRef1)local_54;
  lj_opt_fold(J);
  if (bVar10) {
    J->maxslot = (uint)bVar3;
    pBVar11 = fori + ((ulong)*(ushort *)((long)fori + 2) - 0x7fff);
  }
  else {
    J->maxslot = bVar3 + 4;
    pBVar11 = fori + 1;
  }
  J->pc = pBVar11;
  J->needsnap = '\x01';
  return LVar14;
}

Assistant:

static LoopEvent rec_for(jit_State *J, const BCIns *fori, int isforl)
{
  BCReg ra = bc_a(*fori);
  TValue *tv = &J->L->base[ra];
  TRef *tr = &J->base[ra];
  IROp op;
  LoopEvent ev;
  TRef stop;
  IRType t;
  if (isforl) {  /* Handle FORL/JFORL opcodes. */
    TRef idx = tr[FORL_IDX];
    if (mref(J->scev.pc, const BCIns) == fori && tref_ref(idx) == J->scev.idx) {
      t = J->scev.t.irt;
      stop = J->scev.stop;
      idx = emitir(IRT(IR_ADD, t), idx, J->scev.step);
      tr[FORL_EXT] = tr[FORL_IDX] = idx;
    } else {
      ScEvEntry scev;
      rec_for_loop(J, fori, &scev, 0);
      t = scev.t.irt;
      stop = scev.stop;
    }
  } else {  /* Handle FORI/JFORI opcodes. */
    BCReg i;
    lj_meta_for(J->L, tv);
    t = (LJ_DUALNUM || tref_isint(tr[FORL_IDX])) ? lj_opt_narrow_forl(J, tv) :
						   IRT_NUM;
    for (i = FORL_IDX; i <= FORL_STEP; i++) {
      if (!tr[i]) sload(J, ra+i);
      lj_assertJ(tref_isnumber_str(tr[i]), "bad FORI argument type");
      if (tref_isstr(tr[i]))
	tr[i] = emitir(IRTG(IR_STRTO, IRT_NUM), tr[i], 0);
      if (t == IRT_INT) {
	if (!tref_isinteger(tr[i]))
	  tr[i] = emitir(IRTGI(IR_CONV), tr[i], IRCONV_INT_NUM|IRCONV_CHECK);
      } else {
	if (!tref_isnum(tr[i]))
	  tr[i] = emitir(IRTN(IR_CONV), tr[i], IRCONV_NUM_INT);
      }
    }
    tr[FORL_EXT] = tr[FORL_IDX];
    stop = tr[FORL_STOP];
    rec_for_check(J, t, rec_for_direction(&tv[FORL_STEP]),
		  stop, tr[FORL_STEP], 1);
  }

  ev = rec_for_iter(&op, tv, isforl);
  if (ev == LOOPEV_LEAVE) {
    J->maxslot = ra+FORL_EXT+1;
    J->pc = fori+1;
  } else {
    J->maxslot = ra;
    J->pc = fori+bc_j(*fori)+1;
  }
  lj_snap_add(J);

  emitir(IRTG(op, t), tr[FORL_IDX], stop);

  if (ev == LOOPEV_LEAVE) {
    J->maxslot = ra;
    J->pc = fori+bc_j(*fori)+1;
  } else {
    J->maxslot = ra+FORL_EXT+1;
    J->pc = fori+1;
  }
  J->needsnap = 1;
  return ev;
}